

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CollectRequiredImageAndAccessInsts
          (deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,ReplaceDescArrayAccessUsingVarIndex *this,Instruction *user)

{
  value_type this_00;
  __node_base_ptr this_01;
  bool bVar1;
  reference ppIVar2;
  function<void_(unsigned_int_*)> local_110;
  value_type local_f0;
  Instruction *inst_from_work_list;
  undefined1 local_c1;
  undefined1 local_c0 [8];
  anon_class_24_3_4350207c decision_to_include_operand;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  work_list;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_inst_ids;
  Instruction *user_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *required_insts
  ;
  
  seen_inst_ids._M_h._M_single_bucket = (__node_base_ptr)user;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&work_list.c.
                      super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
  ::queue<std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>,void>
            ((queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
              *)&decision_to_include_operand.work_list);
  decision_to_include_operand.this =
       (ReplaceDescArrayAccessUsingVarIndex *)
       &work_list.c.
        super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node;
  decision_to_include_operand.seen_inst_ids =
       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        *)&decision_to_include_operand.work_list;
  local_c1 = 0;
  local_c0 = (undefined1  [8])this;
  std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::deque
            (__return_storage_ptr__);
  std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  push_front(__return_storage_ptr__,(value_type *)&seen_inst_ids._M_h._M_single_bucket);
  this_01 = seen_inst_ids._M_h._M_single_bucket;
  std::function<void(unsigned_int*)>::
  function<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CollectRequiredImageAndAccessInsts(spvtools::opt::Instruction*)const::__0&,void>
            ((function<void(unsigned_int*)> *)&inst_from_work_list,
             (anon_class_24_3_4350207c *)local_c0);
  Instruction::ForEachInId
            ((Instruction *)this_01,(function<void_(unsigned_int_*)> *)&inst_from_work_list);
  std::function<void_(unsigned_int_*)>::~function
            ((function<void_(unsigned_int_*)> *)&inst_from_work_list);
  while (bVar1 = std::
                 queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                 ::empty((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          *)&decision_to_include_operand.work_list), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppIVar2 = std::
              queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::front((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                       *)&decision_to_include_operand.work_list);
    local_f0 = *ppIVar2;
    std::
    queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::pop((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
           *)&decision_to_include_operand.work_list);
    std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    push_front(__return_storage_ptr__,&local_f0);
    this_00 = local_f0;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CollectRequiredImageAndAccessInsts(spvtools::opt::Instruction*)const::__0&,void>
              ((function<void(unsigned_int*)> *)&local_110,(anon_class_24_3_4350207c *)local_c0);
    Instruction::ForEachInId(this_00,&local_110);
    std::function<void_(unsigned_int_*)>::~function(&local_110);
  }
  local_c1 = 1;
  std::
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  ::~queue((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
            *)&decision_to_include_operand.work_list);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&work_list.c.
                       super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return __return_storage_ptr__;
}

Assistant:

std::deque<Instruction*>
ReplaceDescArrayAccessUsingVarIndex::CollectRequiredImageAndAccessInsts(
    Instruction* user) const {
  std::unordered_set<uint32_t> seen_inst_ids;
  std::queue<Instruction*> work_list;

  auto decision_to_include_operand = [this, &seen_inst_ids,
                                      &work_list](uint32_t* idp) {
    if (!seen_inst_ids.insert(*idp).second) return;
    Instruction* operand = get_def_use_mgr()->GetDef(*idp);
    if (context()->get_instr_block(operand) != nullptr &&
        (HasImageOrImagePtrType(operand) ||
         operand->opcode() == spv::Op::OpAccessChain ||
         operand->opcode() == spv::Op::OpInBoundsAccessChain)) {
      work_list.push(operand);
    }
  };

  std::deque<Instruction*> required_insts;
  required_insts.push_front(user);
  user->ForEachInId(decision_to_include_operand);
  while (!work_list.empty()) {
    auto* inst_from_work_list = work_list.front();
    work_list.pop();
    required_insts.push_front(inst_from_work_list);
    inst_from_work_list->ForEachInId(decision_to_include_operand);
  }
  return required_insts;
}